

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O1

void __thiscall
Lib::
SkipList<Inferences::ALASCA::BinaryResolutionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LDComparator>
::~SkipList(SkipList<Inferences::ALASCA::BinaryResolutionConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LDComparator>
            *this)

{
  Lhs local_40;
  
  if (this->_left->nodes[0] != (Node *)0x0) {
    do {
      pop(&local_40,this);
    } while (this->_left->nodes[0] != (Node *)0x0);
  }
  if (this->_left != (Node *)0x0) {
    operator_delete(this->_left,0x10);
  }
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }